

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::IsValid(S2Loop *this)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [13];
  undefined1 local_40 [8];
  S2Error error;
  S2Loop *this_local;
  
  error._32_8_ = this;
  S2Error::S2Error((S2Error *)local_40);
  bVar1 = FindValidationError(this,(S2Error *)local_40);
  if (bVar1) {
    if ((FLAGS_s2debug & 1U) != 0) {
      S2LogMessage::S2LogMessage
                (&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
                 ,0x83,kError,(ostream *)&std::cerr);
      poVar2 = S2LogMessage::stream(&local_60);
      poVar2 = ::operator<<(poVar2,(S2Error *)local_40);
      S2LogMessageVoidify::operator&(local_4d,poVar2);
      S2LogMessage::~S2LogMessage(&local_60);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  S2Error::~S2Error((S2Error *)local_40);
  return this_local._7_1_;
}

Assistant:

bool S2Loop::IsValid() const {
  S2Error error;
  if (FindValidationError(&error)) {
    S2_LOG_IF(ERROR, FLAGS_s2debug) << error;
    return false;
  }
  return true;
}